

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encoder_kernel_2.cpp
# Opt level: O3

void __thiscall
dlib::entropy_encoder_kernel_2::set_stream(entropy_encoder_kernel_2 *this,ostream *out_)

{
  if (this->out != (ostream *)0x0) {
    flush(this);
  }
  this->out = out_;
  this->streambuf = *(streambuf **)(&out_->field_0xe8 + (long)out_->_vptr_basic_ostream[-3]);
  this->low = this->initial_low;
  this->high = this->initial_high;
  return;
}

Assistant:

void entropy_encoder_kernel_2::
    set_stream (
        std::ostream& out_
    )
    {
        if (out != 0)
        {
            // if a stream is currently set then flush the buffers to it before
            // we switch to the new stream
            flush();
        }
    
        out = &out_;
        streambuf = out_.rdbuf();

        // reset the encoder state
        low = initial_low;
        high = initial_high;
    }